

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_adc_CC(TCGContext_conflict1 *tcg_ctx,TCGv_i32 dest,TCGv_i32 t0,TCGv_i32 t1)

{
  TCGv_i32 ret;
  uintptr_t o;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_movi_i32(tcg_ctx,ret,0);
  tcg_gen_add2_i32_aarch64(tcg_ctx,tcg_ctx->cpu_NF,tcg_ctx->cpu_CF,t0,ret,tcg_ctx->cpu_CF,ret);
  tcg_gen_add2_i32_aarch64
            (tcg_ctx,tcg_ctx->cpu_NF,tcg_ctx->cpu_CF,tcg_ctx->cpu_NF,tcg_ctx->cpu_CF,t1,ret);
  tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_ZF,tcg_ctx->cpu_NF);
  tcg_gen_xor_i32(tcg_ctx,tcg_ctx->cpu_VF,tcg_ctx->cpu_NF,t0);
  tcg_gen_xor_i32(tcg_ctx,ret,t0,t1);
  tcg_gen_andc_i32_aarch64(tcg_ctx,tcg_ctx->cpu_VF,tcg_ctx->cpu_VF,ret);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_gen_mov_i32(tcg_ctx,dest,tcg_ctx->cpu_NF);
  return;
}

Assistant:

static void gen_adc_CC(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    if (TCG_TARGET_HAS_add2_i32) {
        tcg_gen_movi_i32(tcg_ctx, tmp, 0);
        tcg_gen_add2_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, t0, tmp, tcg_ctx->cpu_CF, tmp);
        tcg_gen_add2_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, t1, tmp);
    } else {
        TCGv_i64 q0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 q1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64(tcg_ctx, q0, t0);
        tcg_gen_extu_i32_i64(tcg_ctx, q1, t1);
        tcg_gen_add_i64(tcg_ctx, q0, q0, q1);
        tcg_gen_extu_i32_i64(tcg_ctx, q1, tcg_ctx->cpu_CF);
        tcg_gen_add_i64(tcg_ctx, q0, q0, q1);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, q0);
        tcg_temp_free_i64(tcg_ctx, q0);
        tcg_temp_free_i64(tcg_ctx, q1);
    }
    tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_ZF, tcg_ctx->cpu_NF);
    tcg_gen_xor_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF, t0);
    tcg_gen_xor_i32(tcg_ctx, tmp, t0, t1);
    tcg_gen_andc_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_gen_mov_i32(tcg_ctx, dest, tcg_ctx->cpu_NF);
}